

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O1

string * handle_server_list_long_page_abi_cxx11_(string_view param_1)

{
  Server *pSVar1;
  char cVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  long lVar3;
  void *local_68;
  void *local_60;
  long local_58;
  string local_50;
  
  RenX::getCore();
  RenX::Core::getServers();
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  (this->_M_dataplus)._M_p = (pointer)&this->field_2;
  this->_M_string_length = 0;
  (this->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (this,((long)local_60 - (long)local_68) * 0x20);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (this,0,this->_M_string_length,"[",1);
  if (local_60 == local_68) {
    lVar3 = 0;
  }
  else {
    lVar3 = 0;
    do {
      pSVar1 = *(Server **)((long)local_68 + lVar3 * 8);
      cVar2 = RenX::Server::isConnected();
      if ((cVar2 != '\0') && (cVar2 = RenX::Server::isFullyConnected(), cVar2 != '\0')) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (this,"\n\t",2);
        RenX_ServerListPlugin::server_as_long_json_abi_cxx11_(&local_50,&pluginInstance,pSVar1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (this,local_50._M_dataplus._M_p,local_50._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        lVar3 = lVar3 + 1;
        break;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != (long)local_60 - (long)local_68 >> 3);
  }
  if (lVar3 != (long)local_60 - (long)local_68 >> 3) {
    do {
      pSVar1 = *(Server **)((long)local_68 + lVar3 * 8);
      cVar2 = RenX::Server::isConnected();
      if ((cVar2 != '\0') && (cVar2 = RenX::Server::isFullyConnected(), cVar2 != '\0')) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (this,",\n\t",3);
        RenX_ServerListPlugin::server_as_long_json_abi_cxx11_(&local_50,&pluginInstance,pSVar1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (this,local_50._M_dataplus._M_p,local_50._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != (long)local_60 - (long)local_68 >> 3);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (this,"\n]",2);
  if (local_68 != (void *)0x0) {
    operator_delete(local_68,local_58 - (long)local_68);
  }
  return this;
}

Assistant:

std::string* handle_server_list_long_page(std::string_view) {
	const auto& servers = RenX::getCore()->getServers();
	size_t index = 0;
	RenX::Server *server;
	std::string *server_list_long_json = new std::string;
	server_list_long_json->reserve(256 * servers.size());

	// regenerate server_list_json

	*server_list_long_json = "["sv;

	while (index != servers.size()) {
		server = servers[index];
		if (server->isConnected() && server->isFullyConnected()) {
			*server_list_long_json += "\n\t"sv;
			*server_list_long_json += pluginInstance.server_as_long_json(*server);
			++index;
			break;
		}
		++index;
	}
	while (index != servers.size()) {
		server = servers[index];
		if (server->isConnected() && server->isFullyConnected()) {
			*server_list_long_json += ",\n\t"sv;
			*server_list_long_json += pluginInstance.server_as_long_json(*server);
		}
		++index;
	}

	*server_list_long_json += "\n]"sv;

	return server_list_long_json;
}